

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgga_x_scanl.c
# Opt level: O3

void set_ext_params(xc_func_type *p,double *ext_params)

{
  double dVar1;
  
  dVar1 = get_ext_param(p,ext_params,0);
  *p->mix_coef = 1.0 - dVar1;
  p->cam_alpha = dVar1;
  return;
}

Assistant:

static void
set_ext_params(xc_func_type *p, const double *ext_params)
{
  const double *par_scan = NULL, *par_pc07 = NULL;
  if(ext_params != NULL) {
    par_scan = ext_params;
    par_pc07 = ext_params+4;
  }
  assert(p != NULL && p->func_aux != NULL);
  xc_func_set_ext_params(p->func_aux[0], par_scan);
  xc_func_set_ext_params(p->func_aux[1], par_pc07);
}